

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pragmaVtabCursorClear(PragmaVtabCursor *pCsr)

{
  sqlite3_stmt *in_RDI;
  int i;
  int local_c;
  
  sqlite3_finalize(in_RDI);
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    sqlite3_free((void *)0x1a387c);
    *(undefined8 *)(in_RDI + (long)local_c * 8 + 0x18) = 0;
  }
  return;
}

Assistant:

static void pragmaVtabCursorClear(PragmaVtabCursor *pCsr){
  int i;
  sqlite3_finalize(pCsr->pPragma);
  pCsr->pPragma = 0;
  pCsr->iRowid = 0;
  for(i=0; i<ArraySize(pCsr->azArg); i++){
    sqlite3_free(pCsr->azArg[i]);
    pCsr->azArg[i] = 0;
  }
}